

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelayedDestructor.hpp
# Opt level: O0

size_t __thiscall
gmlc::concurrency::DelayedDestructor<helics::Core>::destroyObjects
          (DelayedDestructor<helics::Core> *this,milliseconds delay)

{
  bool bVar1;
  undefined1 uVar2;
  milliseconds __rhs;
  rep rVar3;
  rep in_RSI;
  long in_RDI;
  DelayedDestructor<helics::Core> *in_stack_00000028;
  size_type elementSize;
  int cnt;
  int delayCount;
  milliseconds delayTime;
  milliseconds minDelay;
  unique_lock<std::timed_mutex> lock;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_fffffffffffffed8;
  undefined5 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee5;
  undefined1 in_stack_fffffffffffffee6;
  strong_ordering in_stack_fffffffffffffee7;
  int local_108;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_ffffffffffffff00;
  milliseconds in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff20;
  __unspec local_b1;
  rep local_b0;
  type local_a1;
  size_type local_a0;
  int local_98;
  __unspec local_91;
  rep local_90;
  type local_81;
  int local_80;
  __unspec local_79;
  rep local_78;
  type local_69;
  rep local_68;
  undefined4 local_5c;
  __unspec local_55 [13];
  rep local_48;
  type local_39;
  rep local_38;
  unique_lock<std::timed_mutex> local_28;
  duration<long,_std::ratio<1L,_1000L>_> local_10;
  size_type local_8;
  
  local_10.__r = in_RSI;
  std::unique_lock<std::timed_mutex>::unique_lock(&local_28);
  local_48 = (rep)ms<(char)50,(char)48,(char)48>();
  local_39 = (type)std::chrono::
                   operator<=><long,_std::ratio<1L,_1000L>,_long,_std::ratio<1L,_1000L>_>
                             ((duration<long,_std::ratio<1L,_1000L>_> *)
                              in_stack_ffffffffffffff08.__r,in_stack_ffffffffffffff00);
  CLI::std::__cmp_cat::__unspec::__unspec(local_55,(__unspec *)0x0);
  bVar1 = std::operator>(local_39);
  if (bVar1) {
    local_38 = local_10.__r;
  }
  else {
    local_38 = (rep)ms<(char)50,(char)48,(char)48>();
  }
  uVar2 = std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                    ((unique_lock<std::timed_mutex> *)
                     CONCAT17(in_stack_fffffffffffffee7._M_value,
                              CONCAT16(in_stack_fffffffffffffee6,
                                       CONCAT15(in_stack_fffffffffffffee5,in_stack_fffffffffffffee0)
                                      )),in_stack_fffffffffffffed8);
  if ((bool)uVar2) {
    local_78 = (rep)ms<(char)49,(char)48,(char)48>();
    local_69 = (type)std::chrono::
                     operator<=><long,_std::ratio<1L,_1000L>,_long,_std::ratio<1L,_1000L>_>
                               ((duration<long,_std::ratio<1L,_1000L>_> *)
                                in_stack_ffffffffffffff08.__r,in_stack_ffffffffffffff00);
    CLI::std::__cmp_cat::__unspec::__unspec(&local_79,(__unspec *)0x0);
    bVar1 = CLI::std::operator<(local_69);
    if (bVar1) {
      local_68 = local_10.__r;
    }
    else {
      in_stack_ffffffffffffff08 = ms<(char)53,(char)48>();
      local_68 = in_stack_ffffffffffffff08.__r;
    }
    __rhs = ms<(char)49,(char)48,(char)48>();
    local_90 = __rhs.__r;
    local_81 = (type)std::chrono::
                     operator<=><long,_std::ratio<1L,_1000L>,_long,_std::ratio<1L,_1000L>_>
                               ((duration<long,_std::ratio<1L,_1000L>_> *)
                                in_stack_ffffffffffffff08.__r,
                                (duration<long,_std::ratio<1L,_1000L>_> *)__rhs.__r);
    CLI::std::__cmp_cat::__unspec::__unspec(&local_91,(__unspec *)0x0);
    bVar1 = CLI::std::operator<(local_81);
    if (bVar1) {
      local_108 = 1;
    }
    else {
      rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_10);
      local_108 = (int)(rVar3 / 0x32);
    }
    local_80 = local_108;
    local_98 = 0;
    local_a0 = std::
               vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
               ::size((vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                       *)(in_RDI + 0x28));
    do {
      do {
        if (local_a0 == 0 || local_80 <= local_98) {
          local_8 = std::
                    vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                    ::size((vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                            *)(in_RDI + 0x28));
          goto LAB_004fdf60;
        }
        if (0 < local_98) {
          local_b0 = (rep)ms<(char)52>();
          in_stack_fffffffffffffee7 =
               std::chrono::operator<=><long,_std::ratio<1L,_1000L>,_long,_std::ratio<1L,_1000L>_>
                         ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_ffffffffffffff08.__r,
                          (duration<long,_std::ratio<1L,_1000L>_> *)__rhs.__r);
          local_a1 = in_stack_fffffffffffffee7._M_value;
          CLI::std::__cmp_cat::__unspec::__unspec(&local_b1,(__unspec *)0x0);
          bVar1 = std::operator>(local_a1);
          if (bVar1) {
            std::unique_lock<std::timed_mutex>::unlock
                      ((unique_lock<std::timed_mutex> *)
                       CONCAT17(in_stack_fffffffffffffee7._M_value,
                                CONCAT16(in_stack_fffffffffffffee6,
                                         CONCAT15(in_stack_fffffffffffffee5,
                                                  in_stack_fffffffffffffee0))));
            std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                      ((duration<long,_std::ratio<1L,_1000L>_> *)
                       CONCAT17(uVar2,in_stack_ffffffffffffff20));
            in_stack_fffffffffffffee6 =
                 std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                           ((unique_lock<std::timed_mutex> *)
                            CONCAT17(in_stack_fffffffffffffee7._M_value,
                                     CONCAT16(in_stack_fffffffffffffee6,
                                              CONCAT15(in_stack_fffffffffffffee5,
                                                       in_stack_fffffffffffffee0))),
                            in_stack_fffffffffffffed8);
            if (!(bool)in_stack_fffffffffffffee6) {
              local_8 = local_a0;
              goto LAB_004fdf60;
            }
          }
        }
        local_98 = local_98 + 1;
        local_a0 = std::
                   vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                   ::size((vector<std::shared_ptr<helics::Core>,_std::allocator<std::shared_ptr<helics::Core>_>_>
                           *)(in_RDI + 0x28));
      } while (local_a0 == 0);
      std::unique_lock<std::timed_mutex>::unlock
                ((unique_lock<std::timed_mutex> *)
                 CONCAT17(in_stack_fffffffffffffee7._M_value,
                          CONCAT16(in_stack_fffffffffffffee6,
                                   CONCAT15(in_stack_fffffffffffffee5,in_stack_fffffffffffffee0))));
      destroyObjects(in_stack_00000028);
      in_stack_fffffffffffffee5 =
           std::unique_lock<std::timed_mutex>::try_lock_for<long,std::ratio<1l,1000l>>
                     ((unique_lock<std::timed_mutex> *)
                      CONCAT17(in_stack_fffffffffffffee7._M_value,
                               CONCAT16(in_stack_fffffffffffffee6,
                                        CONCAT15(in_stack_fffffffffffffee5,in_stack_fffffffffffffee0
                                                ))),in_stack_fffffffffffffed8);
    } while ((bool)in_stack_fffffffffffffee5);
    local_8 = local_a0;
  }
  else {
    local_8 = 0xffffffffffffffff;
  }
LAB_004fdf60:
  local_5c = 1;
  std::unique_lock<std::timed_mutex>::~unique_lock
            ((unique_lock<std::timed_mutex> *)
             CONCAT17(in_stack_fffffffffffffee7._M_value,
                      CONCAT16(in_stack_fffffffffffffee6,
                               CONCAT15(in_stack_fffffffffffffee5,in_stack_fffffffffffffee0))));
  return local_8;
}

Assistant:

size_t destroyObjects(std::chrono::milliseconds delay)
    {
        using namespace std::literals::chrono_literals;
        std::unique_lock<std::timed_mutex> lock(destructionLock,
                                                std::defer_lock);
        auto minDelay = (delay > 200ms) ? delay : 200ms;
        if (!lock.try_lock_for(minDelay)) {
            return static_cast<size_t>(-1);
        }
        auto delayTime = (delay < 100ms) ? delay : 50ms;
        int delayCount =
            (delay < 100ms) ? 1 : static_cast<int>((delay.count() / 50));

        int cnt = 0;
        auto elementSize = ElementsToBeDestroyed.size();
        while (elementSize > 0 && (cnt < delayCount)) {
            if (cnt > 0)  // don't sleep on the first loop
            {
                if (delay > 4ms) {
                    lock.unlock();
                    std::this_thread::sleep_for(delayTime);
                    if (!lock.try_lock_for(delayTime)) {
                        return elementSize;
                    }
                }
            }
            ++cnt;
            elementSize = ElementsToBeDestroyed.size();
            if (elementSize > 0) {
                lock.unlock();
                destroyObjects();
                if (!lock.try_lock_for(delayTime)) {
                    return elementSize;
                }
            }
        }
        return ElementsToBeDestroyed.size();
    }